

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CustomExternalWrapperObject.cpp
# Opt level: O0

BOOL __thiscall
Js::CustomExternalWrapperObject::DeleteProperty
          (CustomExternalWrapperObject *this,JavascriptString *propertyNameString,
          PropertyOperationFlags flags)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  uint uVar4;
  undefined4 *puVar5;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  JavascriptString *pJStack_20;
  PropertyOperationFlags flags_local;
  JavascriptString *propertyNameString_local;
  CustomExternalWrapperObject *this_local;
  
  propertyRecord._4_4_ = flags;
  pJStack_20 = propertyNameString;
  propertyNameString_local = (JavascriptString *)this;
  BVar3 = VerifyObjectAlive(this);
  if (BVar3 == 0) {
    this_local._4_4_ = 0;
  }
  else {
    local_30 = (PropertyRecord *)0x0;
    bVar2 = Js::JavascriptOperators::ShouldTryDeleteProperty
                      ((RecyclableObject *)this,pJStack_20,&local_30);
    if (bVar2) {
      if (local_30 == (PropertyRecord *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CustomExternalWrapperObject.cpp"
                                    ,0x460,"(propertyRecord)","propertyRecord");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar5 = 0;
      }
      uVar4 = PropertyRecord::GetPropertyId(local_30);
      this_local._4_4_ =
           (*(this->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x21])
                     (this,(ulong)uVar4,(ulong)propertyRecord._4_4_);
    }
    else {
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL CustomExternalWrapperObject::DeleteProperty(Js::JavascriptString *propertyNameString, Js::PropertyOperationFlags flags)
{
    if (!this->VerifyObjectAlive()) return FALSE;
    Js::PropertyRecord const *propertyRecord = nullptr;
    if (Js::JavascriptOperators::ShouldTryDeleteProperty(this, propertyNameString, &propertyRecord))
    {
        Assert(propertyRecord);
        return DeleteProperty(propertyRecord->GetPropertyId(), flags);
    }

    return TRUE;
}